

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O0

Error __thiscall asmjit::v1_14::CodeHolder::attach(CodeHolder *this,BaseEmitter *emitter)

{
  long *in_RSI;
  ZoneAllocator *in_RDI;
  Error _err_1;
  Error _err;
  uint64_t archMask;
  EmitterType type;
  char *in_stack_00000390;
  int in_stack_0000039c;
  char *in_stack_000003a0;
  BaseEmitter **in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined3 in_stack_ffffffffffffffa4;
  uint32_t n;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  Error local_24;
  
  if (in_RSI == (long *)0x0) {
    local_24 = DebugUtils::errored(2);
  }
  else {
    n = CONCAT13(1,in_stack_ffffffffffffffa4);
    if (*(byte *)(in_RSI + 1) != 0) {
      n = CONCAT13(3 < *(byte *)(in_RSI + 1),in_stack_ffffffffffffffa4);
    }
    if ((char)(n >> 0x18) == '\0') {
      if ((in_RSI[3] & 1L << ((byte)*in_RDI & 0x3f)) == 0) {
        local_24 = DebugUtils::errored(4);
      }
      else if (in_RSI[6] == 0) {
        local_24 = ZoneVector<asmjit::v1_14::BaseEmitter_*>::willGrow
                             ((ZoneVector<asmjit::v1_14::BaseEmitter_*> *)
                              CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),in_RDI,n
                             );
        if ((local_24 == 0) &&
           (local_24 = (**(code **)(*in_RSI + 0x80))(in_RSI,in_RDI), local_24 == 0)) {
          if ((ZoneAllocator *)in_RSI[6] != in_RDI) {
            DebugUtils::assertionFailed(in_stack_000003a0,in_stack_0000039c,in_stack_00000390);
          }
          ZoneVector<asmjit::v1_14::BaseEmitter_*>::appendUnsafe
                    ((ZoneVector<asmjit::v1_14::BaseEmitter_*> *)
                     CONCAT44(n,in_stack_ffffffffffffffa0),in_stack_ffffffffffffff98);
          local_24 = 0;
        }
      }
      else if ((ZoneAllocator *)in_RSI[6] == in_RDI) {
        local_24 = 0;
      }
      else {
        local_24 = DebugUtils::errored(3);
      }
    }
    else {
      local_24 = DebugUtils::errored(3);
    }
  }
  return local_24;
}

Assistant:

Error CodeHolder::attach(BaseEmitter* emitter) noexcept {
  // Catch a possible misuse of the API.
  if (ASMJIT_UNLIKELY(!emitter))
    return DebugUtils::errored(kErrorInvalidArgument);

  // Invalid emitter, this should not be possible.
  EmitterType type = emitter->emitterType();
  if (ASMJIT_UNLIKELY(type == EmitterType::kNone || uint32_t(type) > uint32_t(EmitterType::kMaxValue)))
    return DebugUtils::errored(kErrorInvalidState);

  uint64_t archMask = emitter->_archMask;
  if (ASMJIT_UNLIKELY(!(archMask & (uint64_t(1) << uint32_t(arch())))))
    return DebugUtils::errored(kErrorInvalidArch);

  // This is suspicious, but don't fail if `emitter` is already attached
  // to this code holder. This is not error, but it's not recommended.
  if (emitter->_code != nullptr) {
    if (emitter->_code == this)
      return kErrorOk;
    return DebugUtils::errored(kErrorInvalidState);
  }

  // Reserve the space now as we cannot fail after `onAttach()` succeeded.
  ASMJIT_PROPAGATE(_emitters.willGrow(&_allocator, 1));
  ASMJIT_PROPAGATE(emitter->onAttach(this));

  // Connect CodeHolder <-> BaseEmitter.
  ASMJIT_ASSERT(emitter->_code == this);
  _emitters.appendUnsafe(emitter);

  return kErrorOk;
}